

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppFile.h
# Opt level: O3

void __thiscall cppforth::Forth::deleteFile(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint src;
  uint uVar1;
  int iVar2;
  string filename;
  string local_48;
  
  requireDStackDepth(this,2,"DELETE-FILE");
  this_00 = &this->dStack;
  src = ForthStack<unsigned_int>::getTop(this_00,1);
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  ForthStack<unsigned_int>::pop(this_00);
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  moveFromDataSpace(this,&local_48,src,(ulong)uVar1);
  iVar2 = remove(local_48._M_dataplus._M_p);
  ForthStack<unsigned_int>::setTop(this_00,(uint)(iVar2 == 0) * 0x40 - 0x40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,
                    CONCAT71(local_48.field_2._M_allocated_capacity._1_7_,
                             local_48.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void deleteFile() {
	REQUIRE_DSTACK_DEPTH(2, "DELETE-FILE");

	auto caddr = (dStack.getTop(1));
	auto length = SIZE_T(dStack.getTop()); pop();

	std::string filename{};
	moveFromDataSpace(filename, caddr, length);
	auto result = std::remove(filename.c_str());
	dStack.setTop(static_cast<Cell>(result?errorDeleteFile:0));
}